

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O0

int nn_stcp_send(nn_pipebase *self,nn_msg *msg)

{
  nn_usock *pnVar1;
  nn_chunkref *self_00;
  size_t sVar2;
  long in_RDI;
  nn_iovec iov [3];
  nn_stcp *stcp;
  nn_msg *in_stack_ffffffffffffff98;
  nn_msg *in_stack_ffffffffffffffa0;
  nn_iovec *iov_00;
  nn_usock *self_01;
  
  if (in_RDI == 0) {
    pnVar1 = (nn_usock *)0x0;
  }
  else {
    pnVar1 = (nn_usock *)(in_RDI + -0x210);
  }
  if (pnVar1->state != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)pnVar1->state,
            "NN_STCP_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x80);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((int)pnVar1[1].out.iov[0].iov_len != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","stcp->outstate == NN_STCP_OUTSTATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x81);
    fflush(_stderr);
    nn_err_abort();
  }
  self_01 = pnVar1;
  nn_msg_term((nn_msg *)0x1edb3b);
  nn_msg_mv(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iov_00 = (nn_iovec *)((long)&pnVar1[1].out.iov[0].iov_len + 4);
  self_00 = (nn_chunkref *)nn_chunkref_size(&in_stack_ffffffffffffffa0->sphdr);
  sVar2 = nn_chunkref_size(self_00);
  nn_putll((uint8_t *)iov_00,(long)&self_00->u + sVar2);
  nn_chunkref_data((nn_chunkref *)&pnVar1[1].out.iov[1].iov_len);
  nn_chunkref_size(self_00);
  nn_chunkref_data((nn_chunkref *)&pnVar1[1].task_connected.item);
  nn_chunkref_size(self_00);
  nn_usock_send(self_01,iov_00,(int)((ulong)self_00 >> 0x20));
  *(undefined4 *)&pnVar1[1].out.iov[0].iov_len = 2;
  return 0;
}

Assistant:

static int nn_stcp_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_stcp *stcp;
    struct nn_iovec iov [3];

    stcp = nn_cont (self, struct nn_stcp, pipebase);

    nn_assert_state (stcp, NN_STCP_STATE_ACTIVE);
    nn_assert (stcp->outstate == NN_STCP_OUTSTATE_IDLE);

    /*  Move the message to the local storage. */
    nn_msg_term (&stcp->outmsg);
    nn_msg_mv (&stcp->outmsg, msg);

    /*  Serialise the message header. */
    nn_putll (stcp->outhdr, nn_chunkref_size (&stcp->outmsg.sphdr) +
        nn_chunkref_size (&stcp->outmsg.body));

    /*  Start async sending. */
    iov [0].iov_base = stcp->outhdr;
    iov [0].iov_len = sizeof (stcp->outhdr);
    iov [1].iov_base = nn_chunkref_data (&stcp->outmsg.sphdr);
    iov [1].iov_len = nn_chunkref_size (&stcp->outmsg.sphdr);
    iov [2].iov_base = nn_chunkref_data (&stcp->outmsg.body);
    iov [2].iov_len = nn_chunkref_size (&stcp->outmsg.body);
    nn_usock_send (stcp->usock, iov, 3);

    stcp->outstate = NN_STCP_OUTSTATE_SENDING;

    return 0;
}